

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUtil.c
# Opt level: O0

void Abc_SclTransferGates(Abc_Ntk_t *pOld,Abc_Ntk_t *pNew)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  Abc_Ntk_t *pAVar2;
  int local_24;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNew_local;
  Abc_Ntk_t *pOld_local;
  
  if (pOld->nBarBufs2 < 1) {
    __assert_fail("pOld->nBarBufs2 > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclUtil.c"
                  ,0x69,"void Abc_SclTransferGates(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNew->nBarBufs2 == 0) {
    local_24 = 0;
    do {
      iVar1 = Vec_PtrSize(pOld->vObjs);
      if (iVar1 <= local_24) {
        return;
      }
      pObj_00 = Abc_NtkObj(pOld,local_24);
      if ((((pObj_00 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pObj_00), iVar1 != 0)) &&
          (iVar1 = Abc_ObjIsBarBuf(pObj_00), iVar1 == 0)) &&
         ((pObj_00->field_6).pTemp != (void *)0x0)) {
        pAVar2 = Abc_ObjNtk((pObj_00->field_6).pCopy);
        if (pAVar2 != pNew) {
          __assert_fail("Abc_ObjNtk(pObj->pCopy) == pNew",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclUtil.c"
                        ,0x6f,"void Abc_SclTransferGates(Abc_Ntk_t *, Abc_Ntk_t *)");
        }
        pObj_00->field_5 = ((pObj_00->field_6).pCopy)->field_5;
      }
      local_24 = local_24 + 1;
    } while( true );
  }
  __assert_fail("pNew->nBarBufs2 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclUtil.c"
                ,0x6a,"void Abc_SclTransferGates(Abc_Ntk_t *, Abc_Ntk_t *)");
}

Assistant:

void Abc_SclTransferGates( Abc_Ntk_t * pOld, Abc_Ntk_t * pNew )
{
    Abc_Obj_t * pObj; int i;
    assert( pOld->nBarBufs2 > 0 );
    assert( pNew->nBarBufs2 == 0 );
    Abc_NtkForEachNodeNotBarBuf( pOld, pObj, i )
    {
        if ( pObj->pCopy == NULL )
            continue;
        assert( Abc_ObjNtk(pObj->pCopy) == pNew );
        pObj->pData = pObj->pCopy->pData;
    }
}